

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# example.cpp
# Opt level: O3

void __thiscall
Customize::serialize_impl<serialization::json_oarchive>(Customize *this,json_oarchive *ar)

{
  Writer<rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
  *this_00;
  char *str;
  undefined *str_00;
  size_t sVar1;
  
  str = serialization_meta()::meta;
  this_00 = &ar->writer_;
  sVar1 = strlen(serialization_meta()::meta);
  rapidjson::
  Writer<rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
  ::String(this_00,str,(SizeType)sVar1,false);
  rapidjson::
  Writer<rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
  ::Int(this_00,this->a);
  str_00 = PTR_anon_var_dwarf_155e0_001211d0;
  sVar1 = strlen(PTR_anon_var_dwarf_155e0_001211d0);
  rapidjson::
  Writer<rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
  ::String(this_00,str_00,(SizeType)sVar1,false);
  rapidjson::
  Writer<rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
  ::String(this_00,(this->b)._M_dataplus._M_p,(SizeType)(this->b)._M_string_length,false);
  return;
}

Assistant:

int main(int argc, char * argv[])
{
    try
    {
        AddressBook ab = {
            {
                {"aaaaaaa", 12},
                {"qwasasdq", 22331},
                {"12qweqweqweqwe", 123123}
            },
            "opt string",
            {
                {"a", {"a", 1} },
                {"b", {"b", 2} },
                {"c", {"c", 3} },
            },
            {
                { {1, 2, 3}, {4, 5, 6}, {7, 8, 9} },
                { {11, 12, 13}, {14, 15, 16} },
                { {21, 22, 23} },
            }
        };

        // json serialize
        serialization::json_oarchive json_oa;
        serialization::serialize(json_oa, ab);
        std::cout << "json serilize result: " << json_oa.data() << std::endl;

        // json unserialize
        AddressBook ab2;
        serialization::json_iarchive json_ia;
        json_ia.load_data(json_oa.data());
        serialization::unserialize(json_ia, ab2);
        std::cout << "json unserilize result: " << (ab == ab2 ? "success" : "fail") << std::endl;

        // xml serialize
        serialization::xml_oarchive xml_oa;
        serialization::serialize(xml_oa, ab);
        std::string xml_str = xml_oa.data();
        std::cout << "xml serilize result: " << xml_str << std::endl;

        // xml unserialize
        AddressBook ab3;
        serialization::xml_iarchive xml_ia;
        xml_ia.load_data(&xml_str[0]);
        serialization::unserialize(xml_ia, ab3);
        std::cout << "xml unserilize result: " << (ab == ab3 ? "success" : "fail") << std::endl;

        //test coustomize 
        Customize c{123, "456"}, c2;
        serialization::serialize(json_oa, c);
        std::cout << "customize json serilize result: " << json_oa.data() << std::endl;
        json_ia.load_data(json_oa.data());
        serialization::unserialize(json_ia, c2);
        std::cout << "customize json unserilize result: " << (c == c2 ? "success" : "fail") << std::endl;

    }
    catch (serialization::serialization_error & err)
    {
        std::cout << err.where() << ":" << err.what() << std::endl;
    }
}